

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void * sapp_wgpu_get_depth_stencil_view(void)

{
  if (_sapp.valid) {
    return (void *)0x0;
  }
  __assert_fail("_sapp.valid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_app.h"
                ,0x304d,"const void *sapp_wgpu_get_depth_stencil_view(void)");
}

Assistant:

SOKOL_API_IMPL const void* sapp_wgpu_get_depth_stencil_view(void) {
    SOKOL_ASSERT(_sapp.valid);
    #if defined(_SAPP_EMSCRIPTEN) && defined(SOKOL_WGPU)
        return (const void*) _sapp.emsc.wgpu.depth_stencil_view;
    #else
        return 0;
    #endif
}